

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O2

void __thiscall
flatbuffers::FlatBufferBuilder::AddElement<signed_char>
          (FlatBufferBuilder *this,voffset_t field,char e,char def)

{
  uoffset_t off;
  
  if ((e == def) && (this->force_defaults_ != true)) {
    return;
  }
  off = PushElement<signed_char>(this,e);
  TrackField(this,field,off);
  return;
}

Assistant:

void AddElement(voffset_t field, T e, T def) {
    // We don't serialize values equal to the default.
    if (e == def && !force_defaults_) return;
    auto off = PushElement(e);
    TrackField(field, off);
  }